

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O0

void __thiscall UDPSocket::UDPSocket(UDPSocket *this)

{
  int iVar1;
  string *__return_storage_ptr__;
  UDPSocket *this_local;
  
  this->_vptr_UDPSocket = (_func_int **)&PTR__UDPSocket_00132e10;
  iVar1 = ::socket(2,2,0x11);
  (this->super_Socket).sockfd = iVar1;
  if (iVar1 < 0) {
    __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
    sock_error_string_abi_cxx11_(__return_storage_ptr__,"UDPSocket::UDPSocket()");
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  return;
}

Assistant:

UDPSocket::UDPSocket() {
#ifdef _WIN32
  WSADATA d = WSADATA();
  int err = WSAStartup(MAKEWORD(2, 2), &d);
  if (err != 0) {
    throw sock_error_string("WSAStartup failed");
  }
#endif
  if((sockfd = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP)) < 0) {
    throw sock_error_string("UDPSocket::UDPSocket()");
  }
}